

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<int>::InternalDeallocate<false>(RepeatedField<int> *this)

{
  ulong uVar1;
  int iVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *psVar3;
  string *extraout_RAX_02;
  string *psVar4;
  string *extraout_RAX_03;
  string *psVar5;
  ulong in_RCX;
  uint extraout_EDX;
  uint size;
  uint extraout_EDX_00;
  Arena *pAVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 in_SIL;
  int iVar9;
  RepeatedField<int> *this_00;
  ulong *puVar10;
  LongSooRep *this_01;
  SooRep *this_02;
  Arena *pAVar11;
  SooRep *this_03;
  RepeatedPtrFieldBase *pRVar12;
  RepeatedPtrFieldBase *this_04;
  long *plVar13;
  bool bVar14;
  ulong uVar15;
  long alStack_168 [2];
  ulong uStack_158;
  RepeatedPtrFieldBase *pRStack_150;
  RepeatedPtrFieldBase RStack_140;
  RepeatedPtrFieldBase *pRStack_128;
  RepeatedPtrFieldBase RStack_118;
  SooRep *pSStack_100;
  RepeatedPtrFieldBase RStack_f8;
  ulong uStack_e0;
  code *pcStack_d8;
  SooRep SStack_d0;
  ulong uStack_c0;
  SooRep *pSStack_b8;
  code *pcStack_b0;
  RepeatedField<int> *pRStack_90;
  ulong uStack_88;
  undefined1 auStack_78 [24];
  LongSooRep LStack_60;
  ulong auStack_48 [2];
  RepeatedField<int> local_10;
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0) {
    InternalDeallocate<false>(this);
    return;
  }
  this_00 = &local_10;
  InternalDeallocate<false>(this_00);
  uVar7 = (this_00->soo_rep_).field_0.long_rep.elements_int;
  if (((uVar7 & 4) == 0) == (bool)in_SIL) {
    psVar5 = (string *)0x0;
  }
  else {
    LStack_60.size = 0x1d18e0;
    LStack_60.capacity = 0;
    psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       ((bool)in_SIL,(uVar7 & 4) == 0,"was_soo == is_soo()");
  }
  if (psVar5 == (string *)0x0) {
    if (in_RCX == 0) {
      LStack_60.size = 0x1d18f2;
      LStack_60.capacity = 0;
      psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                         ((void *)0x0,(void *)0x0,"elements != nullptr");
    }
    else {
      psVar5 = (string *)0x0;
    }
    if (psVar5 != (string *)0x0) goto LAB_001d1911;
    if ((in_RCX & 7) == 0) {
      psVar5 = (string *)0x0;
    }
    else {
      LStack_60.size = 0x1d1902;
      LStack_60.capacity = 0;
      psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                         (in_RCX & 7,0,
                          "reinterpret_cast<uintptr_t>(elements) % kSooPtrAlignment == uintptr_t{0}"
                         );
    }
    if (psVar5 == (string *)0x0) {
      if ((bool)in_SIL != false) {
        (this_00->soo_rep_).field_0.long_rep.size = *(uint *)&(this_00->soo_rep_).field_0 & 3;
      }
      (this_00->soo_rep_).field_0.long_rep.capacity = extraout_EDX;
      (this_00->soo_rep_).field_0.long_rep.elements_int = in_RCX | 4;
      return;
    }
  }
  else {
    LStack_60.size = 0x1d1911;
    LStack_60.capacity = 0;
    internal::SooRep::set_non_soo();
LAB_001d1911:
    LStack_60.size = 0x1d191e;
    LStack_60.capacity = 0;
    internal::SooRep::set_non_soo();
    psVar5 = extraout_RAX;
  }
  puVar10 = auStack_48;
  LStack_60.size = 0x1d192b;
  LStack_60.capacity = 0;
  internal::SooRep::set_non_soo();
  if ((*puVar10 & 4) == 0) {
    return;
  }
  this_01 = &LStack_60;
  auStack_78._8_8_ = heap_rep;
  internal::SooRep::soo_arena();
  if ((this_01->elements_int & 4) != 0) {
    uStack_88 = 0x1d1954;
    internal::LongSooRep::elements(this_01);
    return;
  }
  this_02 = (SooRep *)auStack_78;
  uStack_88 = 0x1d1967;
  heap_rep();
  pAVar11 = (Arena *)&stack0xffffffffffffff58;
  uVar7 = (ulong)psVar5 & 0xffffffff;
  iVar9 = 2;
  if ((int)psVar5 == 0) {
    iVar9 = (this_02->field_0).long_rep.capacity;
  }
  pRStack_90 = this_00;
  uStack_88 = (ulong)extraout_EDX;
  if (iVar9 < (int)size) {
    pcStack_b0 = (code *)0x1d19b7;
    psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)(int)size,(long)iVar9,"size <= Capacity(is_soo)");
  }
  else {
    psVar5 = (string *)0x0;
  }
  if (psVar5 == (string *)0x0) {
    internal::SooRep::set_size(this_02,SUB81(uVar7,0),size);
    return;
  }
  pcStack_b0 = internal::SooRep::set_size;
  set_size();
  this_03 = &SStack_d0;
  uVar8 = (ulong)extraout_EDX_00;
  uVar15 = (ulong)psVar5 & 0xffffffff;
  uVar1 = (pAVar11->impl_).tag_and_id_;
  bVar14 = SUB81(uVar15,0);
  uStack_c0 = (ulong)size;
  pSStack_b8 = this_02;
  pcStack_b0 = (code *)uVar7;
  if (((uVar1 & 4) == 0) == bVar14) {
    psVar5 = (string *)0x0;
  }
  else {
    pcStack_d8 = (code *)0x1d1a2f;
    psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       (bVar14,(uVar1 & 4) == 0,"is_soo == this->is_soo()");
  }
  if (psVar5 == (string *)0x0) {
    if (bVar14 == false) {
      *(uint *)&(pAVar11->impl_).alloc_policy_.policy_ = extraout_EDX_00;
    }
    else {
      if ((int)extraout_EDX_00 < 4) {
        psVar5 = (string *)0x0;
      }
      else {
        pcStack_d8 = (code *)0x1d1a44;
        psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (uVar8,3,"size <= kSooSizeMask");
      }
      if (psVar5 != (string *)0x0) goto LAB_001d1a51;
      (pAVar11->impl_).tag_and_id_ =
           (long)(int)extraout_EDX_00 | (pAVar11->impl_).tag_and_id_ & 0xfffffffffffffff8;
    }
    return;
  }
  pcStack_d8 = (code *)0x1d1a51;
  internal::SooRep::set_size();
  psVar5 = extraout_RAX_00;
LAB_001d1a51:
  iVar9 = (int)psVar5;
  pcStack_d8 = Mutable;
  internal::SooRep::set_size();
  pRVar12 = &RStack_f8;
  pAVar6 = (Arena *)(long)iVar9;
  RStack_f8.arena_ = pAVar11;
  uStack_e0 = uVar15;
  pcStack_d8 = (code *)uVar8;
  if (iVar9 < 0) {
    pSStack_100 = (SooRep *)0x1d1ac4;
    psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)pAVar6,0,"index >= 0");
  }
  else {
    psVar5 = (string *)0x0;
  }
  if (psVar5 == (string *)0x0) {
    pSStack_100 = (SooRep *)0x1d1a89;
    iVar2 = internal::SooRep::size
                      (this_03,(undefined1  [16])
                               ((undefined1  [16])this_03->field_0 & (undefined1  [16])0x4) ==
                               (undefined1  [16])0x0);
    if (iVar9 < iVar2) {
      psVar5 = (string *)0x0;
    }
    else {
      pSStack_100 = (SooRep *)0x1d1ad8;
      psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pAVar6,(long)iVar2,"index < size()");
    }
    if (psVar5 == (string *)0x0) {
      pSStack_100 = (SooRep *)0x1d1aa6;
      elements((RepeatedField<int> *)this_03,
               (undefined1  [16])((undefined1  [16])this_03->field_0 & (undefined1  [16])0x4) ==
               (undefined1  [16])0x0);
      return;
    }
  }
  else {
    pSStack_100 = (SooRep *)0x1d1ae5;
    Mutable();
    psVar5 = extraout_RAX_01;
  }
  pSStack_100 = (SooRep *)
                internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
  ;
  Mutable();
  iVar9 = (int)psVar5;
  RStack_118.arena_ = pAVar6;
  pSStack_100 = this_03;
  if (iVar9 < 0) {
    pRStack_128 = (RepeatedPtrFieldBase *)0x1d1b3c;
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar9,0,"index >= 0");
  }
  else {
    psVar3 = (string *)0x0;
  }
  if (psVar3 == (string *)0x0) {
    if (iVar9 < pRVar12->current_size_) {
      psVar3 = (string *)0x0;
    }
    else {
      pRStack_128 = (RepeatedPtrFieldBase *)0x1d1b4d;
      psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)iVar9,(long)pRVar12->current_size_,"index < current_size_");
    }
    if (psVar3 == (string *)0x0) {
      pRStack_128 = (RepeatedPtrFieldBase *)0x1d1b20;
      internal::RepeatedPtrFieldBase::element_at(pRVar12,iVar9);
      return;
    }
  }
  else {
    pRStack_128 = (RepeatedPtrFieldBase *)0x1d1b5c;
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>();
    psVar3 = extraout_RAX_02;
  }
  this_04 = &RStack_118;
  pRStack_128 = (RepeatedPtrFieldBase *)0x1d1b69;
  internal::RepeatedPtrFieldBase::
  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>();
  iVar9 = (int)psVar3;
  RStack_140.arena_ = (Arena *)((ulong)psVar5 & 0xffffffff);
  pRStack_128 = pRVar12;
  if (iVar9 < 0) {
    pRStack_150 = (RepeatedPtrFieldBase *)0x1d1bb6;
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar9,0,"index >= 0");
  }
  else {
    psVar4 = (string *)0x0;
  }
  if (psVar4 == (string *)0x0) {
    if (iVar9 < this_04->current_size_) {
      psVar5 = (string *)0x0;
    }
    else {
      pRStack_150 = (RepeatedPtrFieldBase *)0x1d1bc7;
      psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)iVar9,(long)this_04->current_size_,"index < current_size_");
    }
    if (psVar5 == (string *)0x0) {
      pRStack_150 = (RepeatedPtrFieldBase *)0x1d1b9a;
      internal::RepeatedPtrFieldBase::element_at(this_04,iVar9);
      return;
    }
  }
  else {
    pRStack_150 = (RepeatedPtrFieldBase *)0x1d1bd6;
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
              ();
    psVar5 = extraout_RAX_03;
  }
  iVar9 = (int)psVar5;
  pRVar12 = &RStack_140;
  pRStack_150 = (RepeatedPtrFieldBase *)0x1d1be3;
  internal::RepeatedPtrFieldBase::
  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
            ();
  uStack_158 = (ulong)psVar3 & 0xffffffff;
  pRStack_150 = this_04;
  if (iVar9 < 0) {
    psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar9,0,"index >= 0");
  }
  else {
    psVar5 = (string *)0x0;
  }
  if (psVar5 == (string *)0x0) {
    if (iVar9 < pRVar12->current_size_) {
      psVar5 = (string *)0x0;
    }
    else {
      psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)iVar9,(long)pRVar12->current_size_,"index < current_size_");
    }
    if (psVar5 == (string *)0x0) {
      internal::RepeatedPtrFieldBase::element_at(pRVar12,iVar9);
      return;
    }
  }
  else {
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
              ();
  }
  plVar13 = alStack_168;
  internal::RepeatedPtrFieldBase::
  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>();
  if (*plVar13 == 1) {
    return;
  }
  if (*plVar13 == 0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  __assert_fail("is_soo()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xf7c,
                "slot_type *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::soo_slot() [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
               );
}

Assistant:

void InternalDeallocate() {
    ABSL_DCHECK(!is_soo());
    const size_t bytes = Capacity(false) * sizeof(Element) + kHeapRepHeaderSize;
    if (heap_rep()->arena == nullptr) {
      internal::SizedDelete(heap_rep(), bytes);
    } else if (!in_destructor) {
      // If we are in the destructor, we might be being destroyed as part of
      // the arena teardown. We can't try and return blocks to the arena then.
      heap_rep()->arena->ReturnArrayMemory(heap_rep(), bytes);
    }
  }